

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CArena.cpp
# Opt level: O0

void * __thiscall amrex::CArena::alloc(CArena *this,size_t nbytes)

{
  bool bVar1;
  reference pNVar2;
  void *a_block;
  pointer this_00;
  void *a_owner;
  size_t sVar3;
  long in_RDI;
  pair<std::__detail::_Node_iterator<amrex::CArena::Node,_true,_false>,_bool> pVar4;
  Node freeblock;
  void *block;
  size_t N;
  void *vp;
  iterator free_it;
  lock_guard<std::mutex> lock;
  value_type *in_stack_fffffffffffffe18;
  set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
  *in_stack_fffffffffffffe20;
  const_iterator in_stack_fffffffffffffe28;
  unordered_set<amrex::CArena::Node,_amrex::CArena::Node::hash,_std::equal_to<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
  *in_stack_fffffffffffffe30;
  Node *this_01;
  const_iterator in_stack_fffffffffffffe38;
  CArena *in_stack_fffffffffffffe70;
  ulong local_138;
  Node local_f8;
  _Node_iterator_base<amrex::CArena::Node,_false> local_e0;
  undefined1 local_d8;
  Node local_d0;
  _Node_iterator_base<amrex::CArena::Node,_false> local_b8;
  undefined1 local_b0;
  Node local_a8;
  _Base_ptr local_90;
  Node local_88;
  _Base_ptr local_70;
  void *local_68;
  pair<void_*,_unsigned_long> local_60;
  ulong local_50;
  _Self local_48;
  void *local_40;
  _Self local_38;
  _Self local_30 [4];
  size_t local_10;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffe20,
             (mutex_type *)in_stack_fffffffffffffe18);
  local_10 = Arena::align(0x1234d92);
  if (*(long *)(in_RDI + 8) <= (long)(*(long *)(in_RDI + 0xa0) + local_10)) {
    freeUnused_protected(in_stack_fffffffffffffe70);
  }
  local_30[0]._M_node =
       (_Base_ptr)
       std::
       set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
       ::begin((set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
                *)in_stack_fffffffffffffe18);
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::
         set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
         ::end((set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
                *)in_stack_fffffffffffffe18);
    bVar1 = std::operator!=(local_30,&local_38);
    if (!bVar1) break;
    pNVar2 = std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator*
                       ((_Rb_tree_const_iterator<amrex::CArena::Node> *)in_stack_fffffffffffffe20);
    sVar3 = Node::size(pNVar2);
    if (local_10 <= sVar3) break;
    std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator++
              ((_Rb_tree_const_iterator<amrex::CArena::Node> *)in_stack_fffffffffffffe20);
  }
  local_40 = (void *)0x0;
  local_48._M_node =
       (_Base_ptr)
       std::
       set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
       ::end((set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
              *)in_stack_fffffffffffffe18);
  bVar1 = std::operator==(local_30,&local_48);
  if (bVar1) {
    if (local_10 < *(ulong *)(in_RDI + 0x98)) {
      local_138 = *(ulong *)(in_RDI + 0x98);
    }
    else {
      local_138 = local_10;
    }
    local_50 = local_138;
    local_40 = Arena::allocate_system
                         ((Arena *)in_stack_fffffffffffffe28._M_node,
                          (size_t)in_stack_fffffffffffffe20);
    *(ulong *)(in_RDI + 0xa0) = *(long *)(in_RDI + 0xa0) + local_50;
    local_60 = std::make_pair<void*&,unsigned_long_const&>
                         ((void **)in_stack_fffffffffffffe20,
                          (unsigned_long *)in_stack_fffffffffffffe18);
    std::
    vector<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>::
    push_back((vector<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
               *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    if (local_10 < *(ulong *)(in_RDI + 0x98)) {
      local_68 = (void *)((long)local_40 + local_10);
      local_70 = (_Base_ptr)
                 std::
                 set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
                 ::end((set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
                        *)in_stack_fffffffffffffe18);
      Node::Node(&local_88,local_68,local_40,*(long *)(in_RDI + 0x98) - local_10);
      local_90 = (_Base_ptr)
                 std::
                 set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
                 ::insert((set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
                           *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                          in_stack_fffffffffffffe28._M_node);
    }
    Node::Node(&local_a8,local_40,local_40,local_10);
    pVar4 = std::
            unordered_set<amrex::CArena::Node,_amrex::CArena::Node::hash,_std::equal_to<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
            ::insert(in_stack_fffffffffffffe30,(value_type *)in_stack_fffffffffffffe28._M_node);
    local_b8._M_cur =
         (__node_type *)pVar4.first.super__Node_iterator_base<amrex::CArena::Node,_false>._M_cur;
    local_b0 = pVar4.second;
  }
  else {
    pNVar2 = std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator*
                       ((_Rb_tree_const_iterator<amrex::CArena::Node> *)in_stack_fffffffffffffe20);
    a_block = Node::block(pNVar2);
    local_40 = a_block;
    this_00 = std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator->
                        ((_Rb_tree_const_iterator<amrex::CArena::Node> *)0x1235154);
    a_owner = Node::owner(this_00);
    Node::Node(&local_d0,a_block,a_owner,local_10);
    pVar4 = std::
            unordered_set<amrex::CArena::Node,_amrex::CArena::Node::hash,_std::equal_to<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
            ::insert(in_stack_fffffffffffffe30,(value_type *)in_stack_fffffffffffffe28._M_node);
    local_e0._M_cur =
         (__node_type *)pVar4.first.super__Node_iterator_base<amrex::CArena::Node,_false>._M_cur;
    local_d8 = pVar4.second;
    pNVar2 = std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator*
                       ((_Rb_tree_const_iterator<amrex::CArena::Node> *)in_stack_fffffffffffffe20);
    sVar3 = Node::size(pNVar2);
    if (local_10 < sVar3) {
      pNVar2 = std::_Rb_tree_const_iterator<amrex::CArena::Node>::operator*
                         ((_Rb_tree_const_iterator<amrex::CArena::Node> *)in_stack_fffffffffffffe20)
      ;
      local_f8.m_size = pNVar2->m_size;
      local_f8.m_block = pNVar2->m_block;
      local_f8.m_owner = pNVar2->m_owner;
      this_01 = &local_f8;
      sVar3 = Node::size(this_01);
      Node::size(this_01,sVar3 - local_10);
      Node::block(this_01,(void *)((long)local_40 + local_10));
      std::
      set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
      ::insert((set<amrex::CArena::Node,_std::less<amrex::CArena::Node>,_std::allocator<amrex::CArena::Node>_>
                *)this_01,in_stack_fffffffffffffe38,(value_type *)in_stack_fffffffffffffe28._M_node)
      ;
    }
    std::set<amrex::CArena::Node,std::less<amrex::CArena::Node>,std::allocator<amrex::CArena::Node>>
    ::erase_abi_cxx11_(in_stack_fffffffffffffe20,in_stack_fffffffffffffe28);
  }
  *(size_t *)(in_RDI + 0xa8) = local_10 + *(long *)(in_RDI + 0xa8);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x12352f5);
  return local_40;
}

Assistant:

void*
CArena::alloc (std::size_t nbytes)
{
    std::lock_guard<std::mutex> lock(carena_mutex);

    nbytes = Arena::align(nbytes == 0 ? 1 : nbytes);

    if (static_cast<Long>(m_used+nbytes) >= arena_info.release_threshold) {
        freeUnused_protected();
    }

    //
    // Find node in freelist at lowest memory address that'll satisfy request.
    //
    NL::iterator free_it = m_freelist.begin();

    for ( ; free_it != m_freelist.end(); ++free_it) {
        if ((*free_it).size() >= nbytes) {
            break;
        }
    }

    void* vp = 0;

    if (free_it == m_freelist.end())
    {
        const std::size_t N = nbytes < m_hunk ? m_hunk : nbytes;

        vp = allocate_system(N);

        m_used += N;

        m_alloc.push_back(std::make_pair(vp,N));

        if (nbytes < m_hunk)
        {
            //
            // Add leftover chunk to free list.
            //
            // Insert with a hint -- should be largest block in the set.
            //
            void* block = static_cast<char*>(vp) + nbytes;

            m_freelist.insert(m_freelist.end(), Node(block, vp, m_hunk-nbytes));
        }

        m_busylist.insert(Node(vp, vp, nbytes));
    }
    else
    {
        BL_ASSERT((*free_it).size() >= nbytes);
        BL_ASSERT(m_busylist.find(*free_it) == m_busylist.end());

        vp = (*free_it).block();
        m_busylist.insert(Node(vp, free_it->owner(), nbytes));

        if ((*free_it).size() > nbytes)
        {
            //
            // Insert remainder of free block back into freelist.
            //
            // Insert with a hint -- right after the current block being split.
            //
            Node freeblock = *free_it;

            freeblock.size(freeblock.size() - nbytes);

            freeblock.block(static_cast<char*>(vp) + nbytes);

            m_freelist.insert(free_it, freeblock);
        }

        m_freelist.erase(free_it);
    }

    m_actually_used += nbytes;

    BL_ASSERT(!(vp == 0));

    return vp;
}